

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::DeAllocate(MemoryPage *this,void *p)

{
  char (*in_RCX) [29];
  string msg;
  string local_38;
  
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"DeAllocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x9c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  dbgVerifyAddress(this,p);
  memset(p,0xde,this->m_pOwnerAllocator->m_BlockSize);
  *(void **)p = this->m_pNextFreeBlock;
  this->m_pNextFreeBlock = p;
  this->m_NumFreeBlocks = this->m_NumFreeBlocks + 1;
  return;
}

Assistant:

void FixedBlockMemoryAllocator::MemoryPage::DeAllocate(void* p)
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);

    dbgVerifyAddress(p);
    FillWithDebugPattern(p, DeallocatedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
    // Add block to the beginning of the linked list
    *reinterpret_cast<void**>(p) = m_pNextFreeBlock;
    m_pNextFreeBlock             = p;
    ++m_NumFreeBlocks;
}